

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_BinaryRoundTrip_Test::
~Proto3OptionalTest_BinaryRoundTrip_Test(Proto3OptionalTest_BinaryRoundTrip_Test *this)

{
  Proto3OptionalTest_BinaryRoundTrip_Test *this_local;
  
  ~Proto3OptionalTest_BinaryRoundTrip_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, BinaryRoundTrip) {
  proto2_unittest::TestProto3Optional msg;
  TestAllFieldsSet(msg, false);
  SetAllFieldsZero(&msg);
  TestAllFieldsZero(msg);
  TestAllFieldsSet(msg, true);

  proto2_unittest::TestProto3Optional msg2;
  std::string serialized;
  msg.SerializeToString(&serialized);
  EXPECT_TRUE(msg2.ParseFromString(serialized));
  TestAllFieldsZero(msg2);
  TestAllFieldsSet(msg2, true);
}